

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O1

int get_active_cq_level(RATE_CONTROL *rc,PRIMARY_RATE_CONTROL *p_rc,AV1EncoderConfig *oxcf,
                       int intra_only,aom_superres_mode superres_mode,int superres_denom)

{
  aom_rc_mode aVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  
  iVar2 = (oxcf->rc_cfg).cq_level;
  aVar1 = (oxcf->rc_cfg).mode;
  if (((aVar1 & ~AOM_CBR) == AOM_CQ) &&
     (superres_denom != 8 && superres_mode - AOM_SUPERRES_QTHRESH < 2)) {
    iVar3 = 0;
    if (intra_only != 0) {
      iVar3 = (uint)(rc->frames_to_key < 2) * 2 + -2;
    }
    iVar3 = (superres_denom + -8) * iVar3 + iVar2;
    iVar2 = 0;
    if (0 < iVar3) {
      iVar2 = iVar3;
    }
  }
  if (((aVar1 == AOM_CQ) && (0 < p_rc->total_target_bits)) &&
     (dVar4 = (double)p_rc->total_actual_bits / (double)p_rc->total_target_bits, dVar4 < 0.1)) {
    iVar2 = (int)(((double)iVar2 * dVar4) / 0.1);
  }
  return iVar2;
}

Assistant:

static int get_active_cq_level(const RATE_CONTROL *rc,
                               const PRIMARY_RATE_CONTROL *p_rc,
                               const AV1EncoderConfig *const oxcf,
                               int intra_only, aom_superres_mode superres_mode,
                               int superres_denom) {
  const RateControlCfg *const rc_cfg = &oxcf->rc_cfg;
  static const double cq_adjust_threshold = 0.1;
  int active_cq_level = rc_cfg->cq_level;
  if (rc_cfg->mode == AOM_CQ || rc_cfg->mode == AOM_Q) {
    if ((superres_mode == AOM_SUPERRES_QTHRESH ||
         superres_mode == AOM_SUPERRES_AUTO) &&
        superres_denom != SCALE_NUMERATOR) {
      int mult = SUPERRES_QADJ_PER_DENOM_KEYFRAME_SOLO;
      if (intra_only && rc->frames_to_key <= 1) {
        mult = 0;
      } else if (intra_only) {
        mult = SUPERRES_QADJ_PER_DENOM_KEYFRAME;
      } else {
        mult = SUPERRES_QADJ_PER_DENOM_ARFFRAME;
      }
      active_cq_level = AOMMAX(
          active_cq_level - ((superres_denom - SCALE_NUMERATOR) * mult), 0);
    }
  }
  if (rc_cfg->mode == AOM_CQ && p_rc->total_target_bits > 0) {
    const double x = (double)p_rc->total_actual_bits / p_rc->total_target_bits;
    if (x < cq_adjust_threshold) {
      active_cq_level = (int)(active_cq_level * x / cq_adjust_threshold);
    }
  }
  return active_cq_level;
}